

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bellman_ford.h
# Opt level: O2

Path<lemon::SmartDigraph> * __thiscall
lemon::
BellmanFord<lemon::SmartDigraph,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>,_lemon::BellmanFordDefaultTraits<lemon::SmartDigraph,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>_>_>
::negativeCycle(Path<lemon::SmartDigraph> *__return_storage_ptr__,
               BellmanFord<lemon::SmartDigraph,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>,_lemon::BellmanFordDefaultTraits<lemon::SmartDigraph,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>_>_>
               *this)

{
  value_type *__x;
  int iVar1;
  PredMap *pPVar2;
  pointer pNVar3;
  Value *pVVar4;
  Digraph *pDVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  int id;
  NodeMap<int> state;
  int local_54;
  VectorMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_int>
  local_50;
  
  local_54 = -1;
  DigraphExtender<lemon::SmartDigraphBase>::NodeMap<int>::NodeMap
            ((NodeMap<int> *)&local_50,&this->_gr->super_ExtendedSmartDigraphBase,&local_54);
  (__return_storage_ptr__->tail).
  super__Vector_base<lemon::SmartDigraphBase::Arc,_std::allocator<lemon::SmartDigraphBase::Arc>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->tail).
  super__Vector_base<lemon::SmartDigraphBase::Arc,_std::allocator<lemon::SmartDigraphBase::Arc>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->head).
  super__Vector_base<lemon::SmartDigraphBase::Arc,_std::allocator<lemon::SmartDigraphBase::Arc>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->tail).
  super__Vector_base<lemon::SmartDigraphBase::Arc,_std::allocator<lemon::SmartDigraphBase::Arc>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->head).
  super__Vector_base<lemon::SmartDigraphBase::Arc,_std::allocator<lemon::SmartDigraphBase::Arc>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->head).
  super__Vector_base<lemon::SmartDigraphBase::Arc,_std::allocator<lemon::SmartDigraphBase::Arc>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pPVar2 = this->_pred;
  pNVar3 = (this->_process).
           super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar6 = (ulong)((long)(this->_process).
                        super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar3) >> 2;
  uVar8 = 0;
  uVar7 = uVar6 & 0xffffffff;
  if ((int)uVar6 < 1) {
    uVar7 = uVar8;
  }
  do {
    if (uVar8 == uVar7) {
LAB_00171918:
      VectorMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_int>
      ::~VectorMap(&local_50);
      return __return_storage_ptr__;
    }
    uVar6 = (ulong)pNVar3[uVar8]._id;
    if (local_50.container.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar6] == -1) {
      pVVar4 = (pPVar2->
               super_MapExtender<lemon::DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_lemon::SmartDigraphBase::Arc>_>
               ).
               super_DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_lemon::SmartDigraphBase::Arc>
               .super_Map.values;
      pDVar5 = this->_gr;
      while( true ) {
        lVar9 = (long)(int)uVar6;
        if (pVVar4[lVar9]._id == -1) break;
        __x = pVVar4 + lVar9;
        if (uVar8 == (uint)local_50.container.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar9]) {
          std::vector<lemon::SmartDigraphBase::Arc,_std::allocator<lemon::SmartDigraphBase::Arc>_>::
          push_back(&__return_storage_ptr__->head,__x);
          while( true ) {
            pVVar4 = (this->_pred->
                     super_MapExtender<lemon::DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_lemon::SmartDigraphBase::Arc>_>
                     ).
                     super_DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_lemon::SmartDigraphBase::Arc>
                     .super_Map.values;
            iVar1 = (this->_gr->super_ExtendedSmartDigraphBase).super_SmartDigraphBase._arcs.
                    super__Vector_base<lemon::SmartDigraphBase::ArcT,_std::allocator<lemon::SmartDigraphBase::ArcT>_>
                    ._M_impl.super__Vector_impl_data._M_start[pVVar4[lVar9]._id].source;
            lVar9 = (long)iVar1;
            if (iVar1 == (int)uVar6) break;
            std::vector<lemon::SmartDigraphBase::Arc,_std::allocator<lemon::SmartDigraphBase::Arc>_>
            ::push_back(&__return_storage_ptr__->head,pVVar4 + lVar9);
          }
          goto LAB_00171918;
        }
        if (-1 < local_50.container.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar9]) break;
        local_50.container.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar9] = (int)uVar8;
        uVar6 = (ulong)(uint)(pDVar5->super_ExtendedSmartDigraphBase).super_SmartDigraphBase._arcs.
                             super__Vector_base<lemon::SmartDigraphBase::ArcT,_std::allocator<lemon::SmartDigraphBase::ArcT>_>
                             ._M_impl.super__Vector_impl_data._M_start[__x->_id].source;
      }
    }
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

lemon::Path<Digraph> negativeCycle() const {
    typename Digraph::template NodeMap<int> state(*_gr, -1);
    lemon::Path<Digraph>                    cycle;
    for (int i = 0; i < int(_process.size()); ++i) {
      if (state[_process[i]] != -1)
        continue;
      for (Node v = _process[i]; (*_pred)[v] != INVALID;
           v      = _gr->source((*_pred)[v])) {
        if (state[v] == i) {
          cycle.addFront((*_pred)[v]);
          for (Node u = _gr->source((*_pred)[v]); u != v;
               u      = _gr->source((*_pred)[u])) {
            cycle.addFront((*_pred)[u]);
          }
          return cycle;
        } else if (state[v] >= 0) {
          break;
        }
        state[v] = i;
      }
    }
    return cycle;
  }